

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_add_tri(REF_CAVITY ref_cavity,REF_INT tri)

{
  REF_CELL ref_cell_00;
  REF_NODE ref_node_00;
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT already_have_it;
  REF_INT all_local;
  REF_INT seg_nodes [3];
  REF_INT node;
  REF_INT cell_edge;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT tri_local;
  REF_CAVITY ref_cavity_local;
  
  ref_cell_00 = ref_cavity->ref_grid->cell[3];
  ref_node_00 = ref_cavity->ref_grid->node;
  if (((tri < 0) || (ref_cell_00->max <= tri)) ||
     (ref_cell_00->c2n[ref_cell_00->size_per * tri] == -1)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x210,
           "ref_cavity_add_tri","invalid tri");
    ref_cavity_local._4_4_ = 1;
  }
  else {
    ref_cavity_local._4_4_ =
         ref_list_contains(ref_cavity->tri_list,tri,&ref_private_macro_code_rss_1);
    if (ref_cavity_local._4_4_ == 0) {
      if (ref_private_macro_code_rss_1 == 0) {
        ref_cavity_local._4_4_ =
             ref_cell_all_local(ref_cell_00,ref_node_00,tri,&ref_private_macro_code_rss);
        if (ref_cavity_local._4_4_ == 0) {
          if (ref_private_macro_code_rss == 0) {
            ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
            ref_cavity_local._4_4_ = 0;
          }
          else {
            ref_cavity_local._4_4_ = ref_list_push(ref_cavity->tri_list,tri);
            if (ref_cavity_local._4_4_ == 0) {
              for (seg_nodes[2] = 0; seg_nodes[2] < ref_cell_00->edge_per;
                  seg_nodes[2] = seg_nodes[2] + 1) {
                for (seg_nodes[1] = 0; seg_nodes[1] < 2; seg_nodes[1] = seg_nodes[1] + 1) {
                  (&already_have_it)[seg_nodes[1]] =
                       ref_cell_00->c2n
                       [ref_cell_00->e2n[seg_nodes[1] + seg_nodes[2] * 2] +
                        ref_cell_00->size_per * tri];
                }
                seg_nodes[0] = ref_cell_00->c2n[ref_cell_00->node_per + ref_cell_00->size_per * tri]
                ;
                uVar1 = ref_cavity_insert_seg(ref_cavity,&already_have_it);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x223,"ref_cavity_add_tri",(ulong)uVar1,"tri side");
                  return uVar1;
                }
                if (ref_cavity->state != REF_CAVITY_UNKNOWN) {
                  return 0;
                }
              }
              ref_cavity_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x21c,"ref_cavity_add_tri",(ulong)ref_cavity_local._4_4_,"save tri");
            }
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x216,"ref_cavity_add_tri",(ulong)ref_cavity_local._4_4_,"local cell");
        }
      }
      else {
        ref_cavity_local._4_4_ = 0;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x213,"ref_cavity_add_tri",(ulong)ref_cavity_local._4_4_,"have tri?");
    }
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_add_tri(REF_CAVITY ref_cavity, REF_INT tri) {
  REF_CELL ref_cell = ref_grid_tri(ref_cavity_grid(ref_cavity));
  REF_NODE ref_node = ref_grid_node(ref_cavity_grid(ref_cavity));
  REF_INT cell_edge, node;
  REF_INT seg_nodes[3];
  REF_INT all_local, already_have_it;

  RAS(ref_cell_valid(ref_cell, tri), "invalid tri");

  RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), tri, &already_have_it),
      "have tri?");
  if (already_have_it) return REF_SUCCESS;

  RSS(ref_cell_all_local(ref_cell, ref_node, tri, &all_local), "local cell");
  if (!all_local) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), tri), "save tri");

  each_ref_cell_cell_edge(ref_cell, cell_edge) {
    each_ref_cavity_seg_node(ref_cavity, node) {
      seg_nodes[node] = ref_cell_e2n(ref_cell, node, cell_edge, tri);
    }
    seg_nodes[2] = ref_cell_c2n(ref_cell, ref_cell_node_per(ref_cell), tri);
    RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) return REF_SUCCESS;
  }

  return REF_SUCCESS;
}